

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WriteExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT cum_weight_constant,int epcalc,int eptype,int eptype_tvar,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting,int samplesize)

{
  double dVar1;
  pointer plVar2;
  bool bVar3;
  mapped_type *this_00;
  code *pcVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  pointer plVar7;
  long *plVar8;
  int counter;
  float current_loss;
  float local_108;
  OASIS_FLOAT last_computed_loss;
  double local_f0;
  double local_e8;
  double local_e0;
  size_t nextreturnperiodindex;
  int local_d0;
  float local_cc;
  undefined1 local_c8 [16];
  double local_b8;
  double last_computed_rp;
  pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> s;
  reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
  local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
  local_68;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  
  if ((samplesize != 0) && ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tail._M_t._M_impl.super__Rb_tree_header._M_header;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tail._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8 = (double)cum_weight_constant;
    local_cc = (float)samplesize;
    local_d0 = eptype_tvar;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var6 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(items->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>::pair
                (&s,(pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> *)(p_Var6 + 1)
                );
      local_68.current._M_current =
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_70.current._M_current =
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>>
                (&local_68,&local_70);
      plVar2 = s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
               super__Vector_impl_data._M_finish;
      nextreturnperiodindex = 0;
      last_computed_rp = 0.0;
      last_computed_loss = 0.0;
      local_108 = 0.0;
      local_e8 = 0.0;
      bVar3 = false;
      local_f0 = 0.0;
      counter = 1;
      for (plVar7 = s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                    super__Vector_impl_data._M_start; plVar7 != plVar2; plVar7 = plVar7 + 1) {
        dVar1 = plVar7->period_weighting;
        local_f0 = local_f0 + dVar1 * local_b8;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_e0 = 1.0 / local_f0;
          if (!bVar3) {
            local_e8 = local_e0 + 0.0001;
          }
          current_loss = plVar7->value / local_cc;
          if (this->useReturnPeriodFile_ == true) {
            local_c8._0_8_ = this->WriteEPTOutput;
            local_c8._8_8_ = *(undefined8 *)&this->field_0x158;
            WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,
                       local_e0,current_loss,s.first,eptype,epcalc,local_e8,counter,local_108,&tail,
                       local_c8._0_8_,
                       (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                        *)local_c8._8_8_);
            local_108 = local_108 - (local_108 - current_loss) / (float)counter;
          }
          else {
            this_00 = std::
                      map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      ::operator[](&tail,&s.first);
            local_108 = local_108 - (local_108 - current_loss) / (float)counter;
            local_c8._0_8_ = local_e0;
            local_c8._8_4_ = local_108;
            std::vector<TVaR,_std::allocator<TVaR>_>::emplace_back<TVaR>(this_00,(TVaR *)local_c8);
            pcVar4 = (code *)this->WriteEPTOutput;
            if (pcVar4 != (code *)0x0) {
              plVar8 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
              if (((ulong)pcVar4 & 1) != 0) {
                pcVar4 = *(code **)(pcVar4 + *plVar8 + -1);
              }
              (*pcVar4)(SUB84(local_e0,0),current_loss,plVar8,fileIDs,s.first,epcalc,eptype);
            }
          }
          counter = counter + 1;
          bVar3 = true;
        }
      }
      if (this->useReturnPeriodFile_ != false) {
        p_Var5 = (unusedperiodstoweighting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if ((_Rb_tree_header *)p_Var5 ==
              &(unusedperiodstoweighting->_M_t)._M_impl.super__Rb_tree_header) {
            dVar1 = 0.0;
          }
          else {
            local_f0 = local_f0 + (double)p_Var5[1]._M_parent * local_b8;
            dVar1 = 1.0 / local_f0;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          }
          local_c8._0_8_ = this->WriteEPTOutput;
          local_c8._8_8_ = *(undefined8 *)&this->field_0x158;
          WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,dVar1
                     ,0.0,s.first,eptype,epcalc,local_e8,counter,local_108,&tail,local_c8._0_8_,
                     (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                      *)local_c8._8_8_);
          local_108 = local_108 - local_108 / (float)counter;
          counter = counter + 1;
        } while (nextreturnperiodindex <
                 (ulong)((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::_Vector_base<lossval,_std::allocator<lossval>_>::~_Vector_base
                (&s.second.super__Vector_base<lossval,_std::allocator<lossval>_>);
    }
    if ((this->ordFlag_ != false) && (*this->fout_ != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,epcalc,local_d0,&tail);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&tail._M_t);
  }
  return;
}

Assistant:

void aggreports::WriteExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<int, lossvec2> &items,
	const OASIS_FLOAT cum_weight_constant,
	int epcalc, int eptype, int eptype_tvar,
	std::map<int, double> &unusedperiodstoweighting, int samplesize) {

  if (items.size() == 0) return;
  if (samplesize == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
  	if (parquetFileNames_[EPT] != "") {
		os_ept_ = GetParquetStreamWriter(EPT);
		os_ept_exists_ = true;
	}
  }
#endif

  std::map<int, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec2 &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;
    double cumulative_weighting = 0;
    double max_retperiod = 0;
    bool largest_loss = false;

    for (auto lp : lpv) {
      cumulative_weighting += (lp.period_weighting * cum_weight_constant);

      if (lp.period_weighting) {
	double retperiod = 1 / cumulative_weighting;

	if (!largest_loss) {
	  max_retperiod = retperiod + 0.0001;   // Add for floating point errors
	  largest_loss = true;
	}

	if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value / samplesize, s.first, eptype, epcalc,
			       max_retperiod, i, tvar, tail, WriteEPTOutput,
			       os_ept_);
#else
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value / samplesize, s.first, eptype, epcalc,
			       max_retperiod, i, tvar, tail, WriteEPTOutput);
#endif
	  tvar = tvar - ((tvar - (lp.value / samplesize)) / i);
	} else {
	  tvar = tvar - ((tvar - (lp.value / samplesize)) / i);
	  tail[s.first].push_back({retperiod, tvar});
	  if (WriteEPTOutput != nullptr) {
	    (this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, retperiod,
				    lp.value / samplesize);
	  }
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	  if (parquetFileNames_[EPT] != "") {
	    WriteParquetOutput(os_ept_, s.first, epcalc, eptype, retperiod,
			       lp.value / samplesize);
	  }
#endif
	}
	i++;
      }
    }
    if (useReturnPeriodFile_) {
      auto iter = unusedperiodstoweighting.begin();
      do {
	double retperiod = 0;
	if (iter != unusedperiodstoweighting.end()) {
	  cumulative_weighting += (iter->second * cum_weight_constant);
	  retperiod = 1 / cumulative_weighting;
	  ++iter;
	}
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[EPT] != nullptr) WriteTVaR(fileIDs, epcalc, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[EPT] != "") {
    WriteTVaR(os_ept_, epcalc, eptype_tvar, tail);
  }
#endif

}